

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O0

void __thiscall
DetectorSS::DetectorSS(DetectorSS *this,int depth,int width,int lgn,int b,int c,int memory)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  ostream *poVar9;
  ulong uVar10;
  void *pvVar11;
  size_t n;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int in_stack_00000008;
  int i_3;
  unsigned_long seed;
  char name [11];
  int i_2;
  int size;
  int i_1;
  int i;
  uint64_t in_stack_fffffffffffffe80;
  int local_70;
  int local_6c;
  int local_54;
  uchar local_48 [12];
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  local_1c = in_R9D;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::
  vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
            *)0x1093dc);
  in_RDI[8] = local_c;
  in_RDI[9] = local_10;
  in_RDI[0x14] = local_14;
  if (local_c < 5) {
    local_6c = local_c;
  }
  else {
    local_6c = 4;
  }
  in_RDI[0x15] = local_6c;
  *in_RDI = local_18;
  in_RDI[1] = local_1c;
  if (in_stack_00000008 < 1) {
    local_70 = local_18 << 1;
  }
  else {
    local_70 = in_stack_00000008 - (local_1c + -1) * local_18;
  }
  in_RDI[2] = local_70;
  if (SBORROW4(in_RDI[2],local_18 * 2) != in_RDI[2] + local_18 * -2 < 0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"Not enough memory for last component: b=");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_18);
    poVar9 = std::operator<<(poVar9,"  c=");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_1c);
    poVar9 = std::operator<<(poVar9,"   mem=");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,in_stack_00000008);
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  dVar12 = log((double)local_18);
  auVar15._0_8_ = log(2.0);
  auVar15._8_56_ = extraout_var;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar12;
  auVar13._0_8_ = (double)local_1c;
  auVar13._8_8_ = extraout_var._0_8_;
  auVar13 = vfmadd213sd_fma(auVar13,auVar15._0_16_,auVar18);
  dVar12 = log(2.0);
  if (dVar12 * 32.0 <= auVar13._0_8_) {
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "Multiresolition bitmap too fine for 32 bit hash: b=");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_18);
    poVar9 = std::operator<<(poVar9,"  c=");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_1c);
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  dVar12 = log((double)local_18);
  auVar16._0_8_ = log(2.0);
  auVar16._8_56_ = extraout_var_00;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar12;
  auVar14._0_8_ = (double)local_1c;
  auVar14._8_8_ = extraout_var_00._0_8_;
  auVar13 = vfmadd213sd_fma(auVar14,auVar16._0_16_,auVar19);
  dVar12 = log(2.0);
  if (dVar12 * 27.0 < auVar13._0_8_) {
    poVar9 = std::operator<<((ostream *)&std::cout,"Unsafe DiscounterMRB for a 32 bit hash: b=");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_18);
    poVar9 = std::operator<<(poVar9,"  c=");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_1c);
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  auVar17._0_8_ = (double)local_18;
  auVar17._8_8_ = 0;
  auVar13 = vfmadd213sd_fma(ZEXT816(0x3fedcb295e9e1b09),auVar17,ZEXT816(0x3fe0000000000000));
  in_RDI[3] = (int)auVar13._0_8_;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(local_1c + 1);
  uVar10 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pvVar11 = operator_new__(uVar10);
  memset(pvVar11,0,uVar10);
  *(void **)(in_RDI + 6) = pvVar11;
  for (local_30 = 0; local_30 < local_1c; local_30 = local_30 + 1) {
    *(int *)(*(long *)(in_RDI + 6) + (long)local_30 * 4) = local_30 * local_18;
  }
  *(int *)(*(long *)(in_RDI + 6) + (long)local_1c * 4) =
       *(int *)(*(long *)(in_RDI + 6) + (long)(local_1c + -1) * 4) + in_RDI[2];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)in_RDI[8];
  uVar10 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pvVar11 = operator_new__(uVar10);
  memset(pvVar11,0,uVar10);
  *(void **)(in_RDI + 4) = pvVar11;
  for (local_34 = 0; local_34 < in_RDI[8]; local_34 = local_34 + 1) {
    local_38 = *(int *)(*(long *)(in_RDI + 6) + (long)local_1c * 4) + 7 >> 3;
    iVar8 = local_38 * in_RDI[9];
    pvVar11 = operator_new__((long)iVar8);
    memset(pvVar11,0,(long)iVar8);
    *(void **)(*(long *)(in_RDI + 4) + (long)local_34 * 8) = pvVar11;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)local_c;
  uVar10 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pvVar11 = operator_new__(uVar10);
  *(void **)(in_RDI + 10) = pvVar11;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)local_c;
  uVar10 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pvVar11 = operator_new__(uVar10);
  *(void **)(in_RDI + 0xc) = pvVar11;
  for (local_3c = 0; local_3c < local_c; local_3c = local_3c + 1) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)local_10;
    uVar10 = SUB168(auVar5 * ZEXT816(4),0);
    if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    pvVar11 = operator_new__(uVar10);
    memset(pvVar11,0,uVar10);
    *(void **)(*(long *)(in_RDI + 10) + (long)local_3c * 8) = pvVar11;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)local_10;
    uVar10 = SUB168(auVar6 * ZEXT816(4),0);
    if (SUB168(auVar6 * ZEXT816(4),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    pvVar11 = operator_new__(uVar10);
    memset(pvVar11,0,uVar10);
    *(void **)(*(long *)(in_RDI + 0xc) + (long)local_3c * 8) = pvVar11;
  }
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (long)local_c;
  uVar10 = SUB168(auVar7 * ZEXT816(8),0);
  if (SUB168(auVar7 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pvVar11 = operator_new__(uVar10);
  *(void **)(in_RDI + 0xe) = pvVar11;
  builtin_memcpy(local_48,"DetectorSS",0xb);
  n = strlen((char *)local_48);
  SS_AwareHash(local_48,n,0x30c4becb9,0x35220fe14f,0x18aa1dca9);
  for (local_54 = 0; local_54 < local_c; local_54 = local_54 + 1) {
    in_stack_fffffffffffffe80 = SS_GenHashSeed((int)(in_stack_fffffffffffffe80 >> 0x20));
    *(uint64_t *)(*(long *)(in_RDI + 0xe) + (long)local_54 * 8) = in_stack_fffffffffffffe80;
  }
  return;
}

Assistant:

DetectorSS::DetectorSS(int depth, int width, int lgn, int b, int c, int memory) {
	ss_.depth = depth;
	ss_.width = width;
	ss_.lgn = lgn;
	ss_.tdepth = depth > 4 ? 4 : depth;
	//init bitmap
	ss_.b = b;
	ss_.c = c;
	ss_.lastb = (memory > 0 ? memory - (c - 1) * b : b * 2);
	if (ss_.lastb < b * 2) {
		std::cout << "Not enough memory for last component: b=" << b << "  c=" << c
			<< "   mem=" << memory << std::endl;
		exit(-1);
	}
	if (log(b) + log(2) * c >= 32 * log(2)) {
		std::cout << "Multiresolition bitmap too fine for 32 bit hash: b=" << b << "  c="
			<< c << std::endl;
		exit(-1);
	}
	if (log(b) + log(2) * c > 27 * log(2)) {
		std::cout << "Unsafe DiscounterMRB for a 32 bit hash: b=" << b << "  c="
			<< c << std::endl;
		exit(-1);
	}

	ss_.setmax = (int)(b * bitsetratio + 0.5);
	ss_.offsets = new int[c + 1]();
	for (int i = 0; i < c; i++) { ss_.offsets[i] = i * b; }
	ss_.offsets[c] = ss_.offsets[c - 1] + ss_.lastb;
	ss_.counts = new unsigned char* [ss_.depth]();
	for (int i = 0; i < ss_.depth; i++) {
		int size = (ss_.offsets[c] + 7) >> 3;
		ss_.counts[i] = new unsigned char[size * ss_.width]();
	}

	//init SSketch
	ss_.skey = new key_tp * [depth];
	ss_.level = new int* [depth];
	for (int i = 0; i < depth; i++) {
		ss_.skey[i] = new key_tp[width]();
		ss_.level[i] = new int[width]();
	}
	ss_.hash = new unsigned long[depth];
	char name[] = "DetectorSS";
	unsigned long seed = SS_AwareHash((unsigned char*)name, strlen(name), 13091204281, 228204732751, 6620830889);
	for (int i = 0; i < depth; i++) {
		ss_.hash[i] = SS_GenHashSeed(seed++);
	}
}